

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPartialsPartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  float *pfVar1;
  long lVar2;
  undefined4 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  
  lVar16 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  if (0 < lVar16) {
    iVar4 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
    iVar17 = startPattern * 4;
    lVar19 = 0;
    auVar5 = vpmovsxbq_avx(ZEXT216(0xa05));
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x100b0601));
    auVar7 = vpmovsxbq_avx2(ZEXT416(0x110c0702));
    auVar8 = vpmovsxbq_avx2(ZEXT416(0x120d0803));
    do {
      if (startPattern < endPattern) {
        lVar20 = (long)iVar17 << 2;
        auVar31 = vpbroadcastq_avx512vl();
        auVar21 = vpaddq_avx(auVar31._0_16_,auVar5);
        lVar2 = lVar19 * 0x14 + 0xf;
        auVar9 = vpermq_avx2(ZEXT1632(auVar21),0xd0);
        auVar9 = vpblendd_avx2(auVar9,auVar31,3);
        auVar32 = vpbroadcastq_avx512vl();
        vpblendd_avx2(auVar9,auVar32,0xc0);
        auVar21 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + (long)matrices2));
        vpaddq_avx2(auVar31,auVar6);
        auVar22 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + (uint)endPattern));
        vpaddq_avx2(auVar31,auVar7);
        auVar23 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + (uint)startPattern));
        vpaddq_avx2(auVar31,auVar8);
        auVar24 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + lVar2));
        auVar25 = vgatherqps_avx512vl(*(undefined8 *)((long)matrices2 * 5));
        auVar26 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + (uint)endPattern));
        auVar27 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + (uint)startPattern));
        auVar28 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + lVar2));
        iVar18 = endPattern - startPattern;
        do {
          uVar3 = *(undefined4 *)((long)partials1 + lVar20 + 4);
          auVar29._4_4_ = uVar3;
          auVar29._0_4_ = uVar3;
          auVar29._8_4_ = uVar3;
          auVar29._12_4_ = uVar3;
          auVar29 = vmulps_avx512vl(auVar22,auVar29);
          uVar3 = *(undefined4 *)((long)partials1 + lVar20);
          auVar30._4_4_ = uVar3;
          auVar30._0_4_ = uVar3;
          auVar30._8_4_ = uVar3;
          auVar30._12_4_ = uVar3;
          auVar29 = vfmadd231ps_avx512vl(auVar29,auVar21,auVar30);
          uVar3 = *(undefined4 *)((long)partials1 + lVar20 + 8);
          auVar10._4_4_ = uVar3;
          auVar10._0_4_ = uVar3;
          auVar10._8_4_ = uVar3;
          auVar10._12_4_ = uVar3;
          auVar29 = vfmadd231ps_avx512vl(auVar29,auVar23,auVar10);
          uVar3 = *(undefined4 *)((long)partials1 + lVar20 + 0xc);
          auVar11._4_4_ = uVar3;
          auVar11._0_4_ = uVar3;
          auVar11._8_4_ = uVar3;
          auVar11._12_4_ = uVar3;
          auVar29 = vfmadd231ps_avx512vl(auVar29,auVar24,auVar11);
          uVar3 = *(undefined4 *)((long)partials2 + lVar20 + 4);
          auVar12._4_4_ = uVar3;
          auVar12._0_4_ = uVar3;
          auVar12._8_4_ = uVar3;
          auVar12._12_4_ = uVar3;
          auVar30 = vmulps_avx512vl(auVar26,auVar12);
          uVar3 = *(undefined4 *)((long)partials2 + lVar20);
          auVar13._4_4_ = uVar3;
          auVar13._0_4_ = uVar3;
          auVar13._8_4_ = uVar3;
          auVar13._12_4_ = uVar3;
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar25,auVar13);
          uVar3 = *(undefined4 *)((long)partials2 + lVar20 + 8);
          auVar14._4_4_ = uVar3;
          auVar14._0_4_ = uVar3;
          auVar14._8_4_ = uVar3;
          auVar14._12_4_ = uVar3;
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar27,auVar14);
          uVar3 = *(undefined4 *)((long)partials2 + lVar20 + 0xc);
          auVar15._4_4_ = uVar3;
          auVar15._0_4_ = uVar3;
          auVar15._8_4_ = uVar3;
          auVar15._12_4_ = uVar3;
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar28,auVar15);
          pfVar1 = (float *)((long)destP + lVar20);
          *pfVar1 = auVar29._0_4_ * auVar30._0_4_;
          pfVar1[1] = auVar29._4_4_ * auVar30._4_4_;
          pfVar1[2] = auVar29._8_4_ * auVar30._8_4_;
          pfVar1[3] = auVar29._12_4_ * auVar30._12_4_;
          lVar20 = lVar20 + 0x10;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      lVar19 = lVar19 + 1;
      iVar17 = iVar17 + iVar4 * 4;
    } while (lVar19 != lVar16);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                                   const REALTYPE* partials1,
                                                                   const REALTYPE* matrices1,
                                                                   const REALTYPE* partials2,
                                                                   const REALTYPE* matrices2,
                                                                   int startPattern,
                                                                   int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            u += 4;

        }
    }
}